

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaNf.c
# Opt level: O3

Gia_Man_t * Nf_ManPerformMapping(Gia_Man_t *pGia,Jf_Par_t *pPars)

{
  undefined1 *puVar1;
  Nf_Mat_t (*paNVar2) [2];
  Nf_Obj_t *pNVar3;
  Vec_Flt_t *pVVar4;
  int iVar5;
  int iVar6;
  Nf_Man_t *p;
  Scl_Con_t *pSVar7;
  Gia_Man_t *pGVar8;
  word wVar9;
  Vec_Int_t *pVVar10;
  char *pTitle;
  ulong uVar11;
  long lVar12;
  long lVar13;
  float fVar14;
  
  pGVar8 = pGia;
  if (pGia->pSibls == (int *)0x0) {
    if (pPars->fCoarsen != 0) {
      pGVar8 = Gia_ManDupMuxes(pGia,pPars->nCoarseLimit);
    }
  }
  else {
    pPars->fCoarsen = 0;
  }
  p = Nf_StoCreate(pGVar8,pPars);
  if ((pPars->fVerbose != 0) && (pPars->fCoarsen != 0)) {
    printf("Initial ");
    Gia_ManPrintMuxStats(pGia);
    putchar(10);
    printf("Derived ");
    Gia_ManPrintMuxStats(pGVar8);
    putchar(10);
  }
  Nf_ManPrintInit(p);
  Nf_ManComputeCuts(p);
  Nf_ManPrintQuit(p);
  pSVar7 = Scl_ConReadMan();
  pGVar8 = p->pGia;
  pVVar10 = pGVar8->vCis;
  if (pSVar7 == (Scl_Con_t *)0x0) {
    if (0 < pVVar10->nSize) {
      lVar13 = 0;
      do {
        iVar6 = pVVar10->pArray[lVar13];
        lVar12 = (long)iVar6;
        if ((lVar12 < 0) || (pGVar8->nObjs <= iVar6)) goto LAB_00700a4c;
        if (iVar6 == 0) break;
        pVVar4 = pGVar8->vInArrs;
        if (pVVar4 == (Vec_Flt_t *)0x0) {
          wVar9 = 0;
        }
        else {
          if (pVVar4->nSize <= lVar13) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecFlt.h"
                          ,0x16e,"float Vec_FltEntry(Vec_Flt_t *, int)");
          }
          fVar14 = 0.0;
          if (0.0 <= pVVar4->pArray[lVar13]) {
            fVar14 = pVVar4->pArray[lVar13];
          }
          uVar11 = (ulong)(fVar14 * 1000.0);
          wVar9 = (long)(fVar14 * 1000.0 - 9.223372e+18) & (long)uVar11 >> 0x3f | uVar11;
        }
        pNVar3 = p->pNfObjs;
        pNVar3[lVar12].M[0][1].D = wVar9;
        pNVar3[lVar12].M[0][0].D = wVar9;
        puVar1 = &pNVar3[lVar12].M[1][0].field_0x3;
        *puVar1 = *puVar1 | 0x40;
        pNVar3[lVar12].M[1][0].D = p->InvDelay + wVar9;
        pNVar3[lVar12].M[1][0].A = p->InvArea;
        puVar1 = &pNVar3[lVar12].M[1][1].field_0x3;
        *puVar1 = *puVar1 | 0x40;
        pNVar3[lVar12].M[1][1].D = wVar9 + p->InvDelay;
        pNVar3[lVar12].M[1][1].A = p->InvArea;
        *(uint *)p->pNfObjs[lVar12].M[0] = *(uint *)p->pNfObjs[lVar12].M[0] | 0x80000000;
        paNVar2 = p->pNfObjs[lVar12].M + 1;
        *(uint *)*paNVar2 = *(uint *)*paNVar2 | 0x80000000;
        lVar13 = lVar13 + 1;
        pGVar8 = p->pGia;
        pVVar10 = pGVar8->vCis;
      } while (lVar13 < pVVar10->nSize);
    }
  }
  else if (0 < pVVar10->nSize) {
    lVar13 = 0;
    do {
      iVar6 = pVVar10->pArray[lVar13];
      lVar12 = (long)iVar6;
      if ((lVar12 < 0) || (pGVar8->nObjs <= iVar6)) {
LAB_00700a4c:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                      ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (iVar6 == 0) break;
      pSVar7 = Scl_ConReadMan();
      if ((pSVar7->vInArrs).nSize <= lVar13) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecWrd.h"
                      ,0x18c,"word Vec_WrdEntry(Vec_Wrd_t *, int)");
      }
      wVar9 = (pSVar7->vInArrs).pArray[lVar13];
      pNVar3 = p->pNfObjs;
      pNVar3[lVar12].M[0][1].D = wVar9;
      pNVar3[lVar12].M[0][0].D = wVar9;
      puVar1 = &pNVar3[lVar12].M[1][0].field_0x3;
      *puVar1 = *puVar1 | 0x40;
      pNVar3[lVar12].M[1][0].D = p->InvDelay + wVar9;
      pNVar3[lVar12].M[1][0].A = p->InvArea;
      puVar1 = &pNVar3[lVar12].M[1][1].field_0x3;
      *puVar1 = *puVar1 | 0x40;
      pNVar3[lVar12].M[1][1].D = wVar9 + p->InvDelay;
      pNVar3[lVar12].M[1][1].A = p->InvArea;
      *(uint *)p->pNfObjs[lVar12].M[0] = *(uint *)p->pNfObjs[lVar12].M[0] | 0x80000000;
      paNVar2 = p->pNfObjs[lVar12].M + 1;
      *(uint *)*paNVar2 = *(uint *)*paNVar2 | 0x80000000;
      lVar13 = lVar13 + 1;
      pGVar8 = p->pGia;
      pVVar10 = pGVar8->vCis;
    } while (lVar13 < pVVar10->nSize);
  }
  p->Iter = 0;
  iVar6 = p->pPars->nRounds;
  if (iVar6 < 1) {
    iVar5 = 0;
  }
  else {
    do {
      Nf_ManComputeMapping(p);
      Nf_ManSetMapRefs(p);
      pTitle = "Area ";
      if (p->Iter == 0) {
        pTitle = "Delay";
      }
      Nf_ManPrintStats(p,pTitle);
      iVar5 = p->Iter + 1;
      p->Iter = iVar5;
      iVar6 = p->pPars->nRounds;
    } while (iVar5 < iVar6);
  }
  p->fUseEla = 1;
  if (iVar5 < iVar6 + pPars->nRoundsEla) {
    do {
      Nf_ManComputeMappingEla(p);
      Nf_ManUpdateStats(p);
      Nf_ManPrintStats(p,"Ela  ");
      iVar6 = p->Iter + 1;
      p->Iter = iVar6;
    } while (iVar6 < pPars->nRoundsEla + p->pPars->nRounds);
  }
  pGVar8 = Nf_ManDeriveMapping(p);
  Nf_StoDelete(p);
  return pGVar8;
}

Assistant:

Gia_Man_t * Nf_ManPerformMapping( Gia_Man_t * pGia, Jf_Par_t * pPars )
{
    Gia_Man_t * pNew = NULL, * pCls;
    Nf_Man_t * p; int i, Id;
    if ( Gia_ManHasChoices(pGia) )
        pPars->fCoarsen = 0; 
    pCls = pPars->fCoarsen ? Gia_ManDupMuxes(pGia, pPars->nCoarseLimit) : pGia;
    p = Nf_StoCreate( pCls, pPars );
//    if ( pPars->fVeryVerbose )
//        Nf_StoPrint( p, pPars->fVeryVerbose );
    if ( pPars->fVerbose && pPars->fCoarsen )
    {
        printf( "Initial " );  Gia_ManPrintMuxStats( pGia );  printf( "\n" );
        printf( "Derived " );  Gia_ManPrintMuxStats( pCls );  printf( "\n" );
    }
    Nf_ManPrintInit( p );
    Nf_ManComputeCuts( p );
    Nf_ManPrintQuit( p );
    if ( Scl_ConIsRunning() )
    {
        Gia_ManForEachCiId( p->pGia, Id, i )
            Nf_ObjPrepareCi( p, Id, Scl_ConGetInArr(i) );
    }
    else
    {
        Gia_ManForEachCiId( p->pGia, Id, i )
            Nf_ObjPrepareCi( p, Id, Nf_Flt2Wrd(p->pGia->vInArrs ? Abc_MaxFloat(0.0, Vec_FltEntry(p->pGia->vInArrs, i)) : 0.0) );
    }
    for ( p->Iter = 0; p->Iter < p->pPars->nRounds; p->Iter++ )
    {
        Nf_ManComputeMapping( p );
        Nf_ManSetMapRefs( p );
        Nf_ManPrintStats( p, (char *)(p->Iter ? "Area " : "Delay") );
    }

    p->fUseEla = 1;
    for ( ; p->Iter < p->pPars->nRounds + pPars->nRoundsEla; p->Iter++ )
    {
        Nf_ManComputeMappingEla( p );
        Nf_ManUpdateStats( p );
        Nf_ManPrintStats( p, "Ela  " );
    }
    pNew = Nf_ManDeriveMapping( p );
    Nf_StoDelete( p );
    return pNew;
}